

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_control_flow.cpp
# Opt level: O0

void multi_cond_multiple_runs(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  anon_class_1_0_00000001 *cs_1;
  Executor *this;
  Enum EVar2;
  Enum EVar3;
  Enum EVar4;
  undefined1 *puVar5;
  uint in_EDI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  Expression_lhs<const_bool_&> EVar6;
  ResultBuilder DOCTEST_RB_3;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Task tempTask2;
  Task tempTask1;
  type *no;
  type *yes;
  type *cond2;
  type *cond1;
  type *init;
  bool flag;
  Taskflow taskflow;
  Executor executor;
  nullptr_t in_stack_fffffffffffff968;
  Task *tasks;
  Result *pRVar7;
  undefined4 in_stack_fffffffffffff970;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff974;
  size_t in_stack_fffffffffffff978;
  int line;
  undefined4 in_stack_fffffffffffff980;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff984;
  Executor *in_stack_fffffffffffff988;
  Enum at;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff9a4;
  anon_class_8_1_898bac6a *in_stack_fffffffffffff9a8;
  anon_class_1_0_00000001 *in_stack_fffffffffffff9b0;
  anon_class_1_0_00000001 *paVar11;
  undefined7 in_stack_fffffffffffff9c8;
  undefined1 in_stack_fffffffffffff9cf;
  anon_class_1_0_00000001 *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  Expression_lhs<const_bool_&> *in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  __basic_future<void> local_570 [2];
  undefined1 local_549;
  Executor *local_548;
  Enum local_540;
  ExpressionDecomposer local_534;
  Executor *local_530;
  Enum local_528;
  ResultBuilder local_500;
  __basic_future<void> local_488 [2];
  undefined1 local_461;
  bool *local_460;
  Enum local_458;
  ExpressionDecomposer local_44c;
  bool *local_448;
  Enum local_440;
  ResultBuilder local_418;
  __basic_future<void> local_3a0 [2];
  undefined1 local_379;
  bool *local_378;
  Enum local_370;
  ExpressionDecomposer local_364;
  bool *local_360;
  Enum local_358;
  ResultBuilder local_330;
  __tuple_element_t<4UL,_tuple<Task,_Task,_Task,_Task,_Task>_> *local_298;
  __tuple_element_t<3UL,_tuple<Task,_Task,_Task,_Task,_Task>_> *local_290;
  __tuple_element_t<2UL,_tuple<Task,_Task,_Task,_Task,_Task>_> *local_288;
  __tuple_element_t<1UL,_tuple<Task,_Task,_Task,_Task,_Task>_> *local_280;
  __tuple_element_t<0UL,_tuple<Task,_Task,_Task,_Task,_Task>_> *local_278;
  undefined1 local_269 [17];
  anon_class_1_0_00000001 local_258 [47];
  undefined1 local_229 [217];
  anon_class_1_0_00000001 local_150 [16];
  undefined1 local_140 [320];
  
  cs_1 = (anon_class_1_0_00000001 *)(ulong)in_EDI;
  paVar11 = local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),in_stack_fffffffffffff968
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffa58);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x121526);
  tf::Taskflow::Taskflow((Taskflow *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
  local_229[0] = 0;
  local_269._1_8_ = local_229;
  tasks = (Task *)local_269;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:994:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:995:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:996:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:997:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:998:5),_nullptr>
            ((FlowBuilder *)CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),paVar11,
             cs_1,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9e0);
  paVar11 = local_258;
  local_278 = std::get<0ul,tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
                        ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x1215a4);
  local_280 = std::get<1ul,tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
                        ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x1215b6);
  local_288 = std::get<2ul,tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
                        ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x1215c8);
  local_290 = std::get<3ul,tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
                        ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x1215da);
  local_298 = std::get<4ul,tf::Task,tf::Task,tf::Task,tf::Task,tf::Task>
                        ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x1215ec);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:1001:41),_nullptr>
            ((FlowBuilder *)cs_1,paVar11);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_control_flow_cpp:1002:41),_nullptr>
            ((FlowBuilder *)cs_1,paVar11);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),tasks);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),tasks);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),tasks);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),tasks);
  tf::Task::precede<tf::Task&>
            ((Task *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),tasks);
  pRVar7 = (Result *)0x1a6a27;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
             (Enum)((ulong)in_stack_fffffffffffff988 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
             (int)(in_stack_fffffffffffff978 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),"",
             (char *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_364,DT_REQUIRE);
  EVar6 = doctest::detail::ExpressionDecomposer::operator<<<bool,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),&pRVar7->m_passed
                    );
  local_378 = EVar6.lhs;
  EVar2 = EVar6.m_at;
  local_379 = 0;
  local_370 = EVar2;
  local_360 = local_378;
  local_358 = EVar2;
  doctest::detail::Expression_lhs<bool_const&>::operator==
            (in_stack_fffffffffffff9f8,
             (bool *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),pRVar7);
  doctest::detail::Result::~Result((Result *)0x121790);
  doctest::detail::ResultBuilder::log(&local_330,__x);
  uVar10 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffff9a0);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1218be);
  puVar5 = local_140;
  tf::Executor::run_n(in_stack_fffffffffffff988,
                      (Taskflow *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                      in_stack_fffffffffffff978);
  std::__basic_future<void>::wait(local_3a0,puVar5);
  tf::Future<void>::~Future
            ((Future<void> *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  pRVar7 = (Result *)0x1a6a27;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
             (Enum)((ulong)in_stack_fffffffffffff988 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
             (int)(in_stack_fffffffffffff978 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),"",
             (char *)CONCAT44(EVar2,uVar10));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_44c,DT_REQUIRE);
  EVar6 = doctest::detail::ExpressionDecomposer::operator<<<bool,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),&pRVar7->m_passed
                    );
  local_460 = EVar6.lhs;
  EVar3 = EVar6.m_at;
  local_461 = 0;
  local_458 = EVar3;
  local_448 = local_460;
  local_440 = EVar3;
  doctest::detail::Expression_lhs<bool_const&>::operator==
            (in_stack_fffffffffffff9f8,
             (bool *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),pRVar7);
  doctest::detail::Result::~Result((Result *)0x1219e9);
  doctest::detail::ResultBuilder::log(&local_418,__x_00);
  uVar8 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffff990);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x121af7);
  puVar5 = local_140;
  tf::Executor::run_n(in_stack_fffffffffffff988,
                      (Taskflow *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                      in_stack_fffffffffffff978);
  EVar4 = (Enum)((ulong)in_stack_fffffffffffff988 >> 0x20);
  std::__basic_future<void>::wait(local_488,puVar5);
  tf::Future<void>::~Future
            ((Future<void> *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  pRVar7 = (Result *)0x1a6a27;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(EVar3,uVar8),EVar4,
             (char *)CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
             (int)(in_stack_fffffffffffff978 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),"",
             (char *)CONCAT44(EVar2,uVar10));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_534,DT_REQUIRE);
  EVar6 = doctest::detail::ExpressionDecomposer::operator<<<bool,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),&pRVar7->m_passed
                    );
  this = (Executor *)EVar6.lhs;
  EVar4 = EVar6.m_at;
  local_549 = 0;
  local_548 = this;
  local_540 = EVar4;
  local_530 = this;
  local_528 = EVar4;
  doctest::detail::Expression_lhs<bool_const&>::operator==
            (in_stack_fffffffffffff9f8,
             (bool *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),pRVar7);
  doctest::detail::Result::~Result((Result *)0x121c22);
  doctest::detail::ResultBuilder::log(&local_500,__x_01);
  uVar9 = CONCAT13(extraout_AL_01,(int3)in_stack_fffffffffffff980);
  if ((extraout_AL_01 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x121d30);
  puVar5 = local_140;
  tf::Executor::run_n(this,(Taskflow *)CONCAT44(EVar4,uVar9),in_stack_fffffffffffff978);
  at = (Enum)((ulong)this >> 0x20);
  line = (int)(in_stack_fffffffffffff978 >> 0x20);
  std::__basic_future<void>::wait(local_570,puVar5);
  tf::Future<void>::~Future
            ((Future<void> *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  pRVar7 = (Result *)0x1a6a27;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(EVar3,uVar8),at,(char *)CONCAT44(EVar4,uVar9),line,
             (char *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),"",
             (char *)CONCAT44(EVar2,uVar10));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffff9e4,DT_REQUIRE);
  EVar6 = doctest::detail::ExpressionDecomposer::operator<<<bool,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),&pRVar7->m_passed
                    );
  EVar3 = EVar6.m_at;
  doctest::detail::Expression_lhs<bool_const&>::operator==
            (in_stack_fffffffffffff9f8,(bool *)CONCAT44(in_stack_fffffffffffff9f4,EVar3));
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(EVar3,in_stack_fffffffffffff970),pRVar7);
  doctest::detail::Result::~Result((Result *)0x121e43);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffa18,__x_02);
  uVar8 = CONCAT13(extraout_AL_02,(int3)in_stack_fffffffffffff970);
  if ((extraout_AL_02 & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)CONCAT44(EVar3,uVar8));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x121f4b);
    tf::Taskflow::~Taskflow((Taskflow *)CONCAT44(EVar3,uVar8));
    tf::Executor::~Executor((Executor *)CONCAT44(EVar2,uVar10));
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void multi_cond_multiple_runs(unsigned W) {
  tf::Executor executor(W);
  tf::Taskflow taskflow;

  bool flag = false;

  auto [init, cond1, cond2, yes, no] = taskflow.emplace(
    [] () { },
    [] () { return 0; },
    [] () { return 1; },
    [&]() { flag = true; },
    [] () { }
  );

  tf::Task tempTask1 = taskflow.emplace([]() {});
  tf::Task tempTask2 = taskflow.emplace([]() {});
  cond2.precede(tempTask2);
  tempTask2.precede(yes);
  init.precede(yes);

  cond1.precede(tempTask1);
  tempTask1.precede(yes);

  REQUIRE(flag == false);

  executor.run_n(taskflow, 1).wait();
  REQUIRE(flag == false);
  
  executor.run_n(taskflow, 2).wait();
  REQUIRE(flag == false);
  
  executor.run_n(taskflow, 3).wait();
  REQUIRE(flag == false);
}